

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_test.cpp
# Opt level: O0

void __thiscall
ContextTest_StringFormatWithEmptyContext_Test::TestBody
          (ContextTest_StringFormatWithEmptyContext_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_458;
  Message local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined1 local_428 [8];
  AssertionResult gtest_ar;
  ostringstream local_408 [8];
  ostringstream os;
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [32];
  CcsContext local_240;
  undefined1 local_230 [8];
  undefined1 local_228 [24];
  CcsContext ctx;
  CcsContext root;
  string local_1f0;
  allocator local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream input;
  CcsDomain local_18;
  CcsDomain ccs;
  ContextTest_StringFormatWithEmptyContext_Test *this_local;
  
  ccs.dag._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
  super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl =
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)this;
  ::ccs::CcsDomain::CcsDomain(&local_18,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"b c : @constrain d.e",&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"<literal>",
             (allocator *)
             ((long)&root.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::loadCcsStream
            (&local_18,(istream *)local_198,&local_1f0,
             (ImportResolver *)&::ccs::(anonymous_namespace)::NoImportResolver);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::CcsDomain::build
            ((CcsDomain *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"c",&local_261);
  ::ccs::CcsContext::constrain
            (&local_240,
             (string *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::ccs::CcsContext::builder((CcsContext *)local_230);
  ::ccs::CcsContext::Builder::build((Builder *)local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"b",&local_289);
  ::ccs::CcsContext::constrain((CcsContext *)(local_228 + 0x10),(string *)local_228);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  ::ccs::CcsContext::~CcsContext((CcsContext *)local_228);
  ::ccs::CcsContext::Builder::~Builder((Builder *)local_230);
  ::ccs::CcsContext::~CcsContext(&local_240);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::ostringstream::ostringstream(local_408);
  ::ccs::CcsContext::CcsContext((CcsContext *)&gtest_ar.message_,(CcsContext *)(local_228 + 0x10));
  ::ccs::operator<<((ostream *)local_408,(CcsContext *)&gtest_ar.message_);
  ::ccs::CcsContext::~CcsContext((CcsContext *)&gtest_ar.message_);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper::
  Compare<char[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_428,"\"c > b/d.e\"","os.str()",(char (*) [10])0x1f82a4,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/context_test.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  std::__cxx11::ostringstream::~ostringstream(local_408);
  ::ccs::CcsContext::~CcsContext((CcsContext *)(local_228 + 0x10));
  ::ccs::CcsContext::~CcsContext
            ((CcsContext *)
             &ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::istringstream::~istringstream(local_198);
  ::ccs::CcsDomain::~CcsDomain(&local_18);
  return;
}

Assistant:

TEST(ContextTest, StringFormatWithEmptyContext) {
  CcsDomain ccs;
  std::istringstream input("b c : @constrain d.e");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext root = ccs.build();
  CcsContext ctx = root.constrain("c").builder().build().constrain("b");
  std::ostringstream os;
  os << ctx;
  EXPECT_EQ("c > b/d.e", os.str());
}